

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_write_signature_det
              (mbedtls_ecdsa_context *ctx,uchar *hash,size_t hlen,uchar *sig,size_t *slen,
              mbedtls_md_type_t md_alg)

{
  int iVar1;
  mbedtls_ecdsa_restart_ctx *in_stack_fffffffffffffff8;
  
  iVar1 = mbedtls_ecdsa_write_signature_restartable
                    (ctx,md_alg,hash,hlen,sig,slen,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                     (void *)0x0,in_stack_fffffffffffffff8);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_write_signature_det( mbedtls_ecdsa_context *ctx,
                               const unsigned char *hash, size_t hlen,
                               unsigned char *sig, size_t *slen,
                               mbedtls_md_type_t md_alg )
{
    ECDSA_VALIDATE_RET( ctx  != NULL );
    ECDSA_VALIDATE_RET( hash != NULL );
    ECDSA_VALIDATE_RET( sig  != NULL );
    ECDSA_VALIDATE_RET( slen != NULL );
    return( mbedtls_ecdsa_write_signature( ctx, md_alg, hash, hlen, sig, slen,
                                   NULL, NULL ) );
}